

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkk.cpp
# Opt level: O1

void __thiscall
HEkk::initialiseBound(HEkk *this,SimplexAlgorithm algorithm,HighsInt solve_phase,bool perturb)

{
  double dVar1;
  char cVar2;
  int iVar3;
  pointer pdVar4;
  pointer pdVar5;
  pointer pcVar6;
  pointer pdVar7;
  pointer pdVar8;
  pointer pcVar9;
  pointer pdVar10;
  pointer piVar11;
  uint uVar12;
  uint uVar13;
  ulong uVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  
  initialiseLpColBound(this);
  initialiseLpRowBound(this);
  (this->info_).bounds_perturbed = false;
  if (algorithm == kPrimal) {
    if (perturb) {
      dVar1 = (this->info_).primal_simplex_bound_perturbation_multiplier;
      if ((dVar1 != 0.0) || (NAN(dVar1))) {
        uVar12 = (this->lp_).num_row_;
        iVar3 = (this->lp_).num_col_;
        uVar13 = iVar3 + uVar12;
        if (uVar13 != 0 && SCARRY4(iVar3,uVar12) == (int)uVar13 < 0) {
          pdVar4 = (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar5 = (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pcVar6 = (this->basis_).nonbasicFlag_.
                   super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar7 = (this->info_).numTotRandomValue_.
                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar8 = (this->info_).workRange_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pcVar9 = (this->basis_).nonbasicMove_.
                   super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pdVar10 = (this->info_).workValue_.super__Vector_base<double,_std::allocator<double>_>.
                    _M_impl.super__Vector_impl_data._M_start;
          uVar14 = 0;
          do {
            dVar15 = pdVar4[uVar14];
            dVar16 = pdVar5[uVar14];
            if (pcVar6[uVar14] == '\x01') {
              if ((dVar15 != dVar16) || (NAN(dVar15) || NAN(dVar16))) goto LAB_003443a1;
            }
            else {
LAB_003443a1:
              dVar17 = pdVar7[uVar14];
              if (dVar15 != -INFINITY) {
                dVar18 = -dVar17 * dVar1 * 5e-07;
                if (-1.0 <= dVar15) {
                  if (1.0 <= dVar15) {
                    dVar18 = dVar18 * dVar15;
                  }
                  dVar15 = dVar15 + dVar18;
                }
                else {
                  dVar15 = dVar15 - dVar18 * dVar15;
                }
                pdVar4[uVar14] = dVar15;
              }
              if (dVar16 != INFINITY) {
                dVar17 = dVar17 * dVar1 * 5e-07;
                if (-1.0 <= dVar16) {
                  if (1.0 <= dVar16) {
                    dVar17 = dVar17 * dVar16;
                  }
                  dVar16 = dVar16 + dVar17;
                }
                else {
                  dVar16 = dVar16 - dVar17 * dVar16;
                }
                pdVar5[uVar14] = dVar16;
              }
              pdVar8[uVar14] = pdVar5[uVar14] - pdVar4[uVar14];
              if ((pcVar6[uVar14] != '\0') &&
                 ((cVar2 = pcVar9[uVar14], '\0' < cVar2 || (dVar15 = dVar16, cVar2 < '\0')))) {
                pdVar10[uVar14] = dVar15;
              }
            }
            uVar14 = uVar14 + 1;
          } while (uVar13 != uVar14);
        }
        if (0 < (int)uVar12) {
          piVar11 = (this->basis_).basicIndex_.super__Vector_base<int,_std::allocator<int>_>._M_impl
                    .super__Vector_impl_data._M_start;
          pdVar4 = (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar5 = (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar7 = (this->info_).baseLower_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          pdVar8 = (this->info_).baseUpper_.super__Vector_base<double,_std::allocator<double>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          uVar14 = 0;
          do {
            iVar3 = piVar11[uVar14];
            pdVar7[uVar14] = pdVar4[iVar3];
            pdVar8[uVar14] = pdVar5[iVar3];
            uVar14 = uVar14 + 1;
          } while (uVar12 != uVar14);
        }
        (this->info_).bounds_perturbed = true;
      }
    }
  }
  else if ((solve_phase != 2) &&
          (iVar3 = (this->lp_).num_row_, uVar12 = iVar3 + (this->lp_).num_col_,
          uVar12 != 0 && SCARRY4(iVar3,(this->lp_).num_col_) == (int)uVar12 < 0)) {
    pdVar4 = (this->info_).workLower_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar5 = (this->info_).workUpper_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    pdVar7 = (this->info_).workRange_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar14 = 0;
    do {
      if (-INFINITY < pdVar4[uVar14]) {
LAB_00344544:
        dVar1 = pdVar5[uVar14];
        pdVar4[uVar14] = 0.0;
        if (dVar1 < INFINITY) {
LAB_0034455d:
          pdVar5[uVar14] = 0.0;
        }
        else {
          pdVar5[uVar14] = 1.0;
        }
      }
      else {
        if (pdVar5[uVar14] < INFINITY) {
          if (-INFINITY < pdVar4[uVar14]) goto LAB_00344544;
          pdVar4[uVar14] = -1.0;
          goto LAB_0034455d;
        }
        pdVar4[uVar14] = -1000.0;
        pdVar5[uVar14] = 1000.0;
      }
      pdVar7[uVar14] = pdVar5[uVar14] - pdVar4[uVar14];
      uVar14 = uVar14 + 1;
    } while (uVar12 != uVar14);
  }
  return;
}

Assistant:

void HEkk::initialiseBound(const SimplexAlgorithm algorithm,
                           const HighsInt solve_phase, const bool perturb) {
  initialiseLpColBound();
  initialiseLpRowBound();
  info_.bounds_perturbed = false;
  // Primal simplex bounds are either from the LP or perturbed
  if (algorithm == SimplexAlgorithm::kPrimal) {
    if (!perturb || info_.primal_simplex_bound_perturbation_multiplier == 0)
      return;
    // Perturb the bounds
    // Determine the smallest and largest finite lower/upper bounds
    HighsInt num_col = lp_.num_col_;
    HighsInt num_row = lp_.num_row_;
    HighsInt num_tot = num_col + num_row;
    double min_abs_lower = kHighsInf;
    double max_abs_lower = -1;
    double min_abs_upper = kHighsInf;
    double max_abs_upper = -1;
    for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
      double abs_lower = fabs(info_.workLower_[iVar]);
      double abs_upper = fabs(info_.workUpper_[iVar]);
      if (abs_lower && abs_lower < kHighsInf) {
        min_abs_lower = min(abs_lower, min_abs_lower);
        max_abs_lower = max(abs_lower, max_abs_lower);
      }
      if (abs_upper && abs_upper < kHighsInf) {
        min_abs_upper = min(abs_upper, min_abs_upper);
        max_abs_upper = max(abs_upper, max_abs_upper);
      }
    }
    // printf(
    //     "Nonzero finite lower bounds in [%9.4g, %9.4g]; upper bounds in "
    //     "[%9.4g, %9.4g]\n",
    //     min_abs_lower, max_abs_lower, min_abs_upper, max_abs_upper);

    const double base =
        info_.primal_simplex_bound_perturbation_multiplier * 5e-7;
    for (HighsInt iVar = 0; iVar < num_tot; iVar++) {
      double lower = info_.workLower_[iVar];
      double upper = info_.workUpper_[iVar];
      const bool fixed = lower == upper;
      // Don't perturb bounds of nonbasic fixed variables as they stay nonbasic
      if (basis_.nonbasicFlag_[iVar] == kNonbasicFlagTrue && fixed) continue;
      double random_value = info_.numTotRandomValue_[iVar];
      if (lower > -kHighsInf) {
        if (lower < -1) {
          lower -= random_value * base * (-lower);
        } else if (lower < 1) {
          lower -= random_value * base;
        } else {
          lower -= random_value * base * lower;
        }
        info_.workLower_[iVar] = lower;
      }
      if (upper < kHighsInf) {
        if (upper < -1) {
          upper += random_value * base * (-upper);
        } else if (upper < 1) {
          upper += random_value * base;
        } else {
          upper += random_value * base * upper;
        }
        info_.workUpper_[iVar] = upper;
      }
      info_.workRange_[iVar] = info_.workUpper_[iVar] - info_.workLower_[iVar];
      if (basis_.nonbasicFlag_[iVar] == kNonbasicFlagFalse) continue;
      // Set values of nonbasic variables
      if (basis_.nonbasicMove_[iVar] > 0) {
        info_.workValue_[iVar] = lower;
      } else if (basis_.nonbasicMove_[iVar] < 0) {
        info_.workValue_[iVar] = upper;
      }
    }
    for (HighsInt iRow = 0; iRow < num_row; iRow++) {
      HighsInt iVar = basis_.basicIndex_[iRow];
      info_.baseLower_[iRow] = info_.workLower_[iVar];
      info_.baseUpper_[iRow] = info_.workUpper_[iVar];
    }
    info_.bounds_perturbed = true;
    return;
  }
  // Dual simplex bounds are either from the LP or set to special values in
  // phase
  // 1
  assert(algorithm == SimplexAlgorithm::kDual);
  if (solve_phase == kSolvePhase2) return;

  // The dual objective is the sum of products of primal and dual
  // values for nonbasic variables. For dual simplex phase 1, the
  // primal bounds are set so that when the dual value is feasible, the
  // primal value is set to zero. Otherwise the value is +1/-1
  // according to the required sign of the dual, except for free
  // variables, where the bounds are [-1000, 1000]. Hence the dual
  // objective is the negation of the sum of infeasibilities, unless there are
  // free In Phase 1: change to dual phase 1 bound.
  const double inf = kHighsInf;
  const HighsInt num_tot = lp_.num_col_ + lp_.num_row_;
  for (HighsInt iCol = 0; iCol < num_tot; iCol++) {
    if (info_.workLower_[iCol] == -inf && info_.workUpper_[iCol] == inf) {
      // Phase 1 bounds were not modified for free rows in hsol. Why?
      // To reduce the number of free variables on the assumption that
      // free rows should never be nonbasic? This is normally true
      // when starting from a logical basis or crash - unless
      // singularity makes a free logical nonbasic - but what about an
      // advanced basis start? It doesn't happen with the HiGHS MIP
      // solver. However, SCIP cut handling can lead to a nonbasic row
      // with nonzero dual being made free and, particularly if it's
      // (then) the only dual infeasibility, phase 1 fails to remove
      // it.
      //
      // if (iCol >= lp_.num_col_) continue;
      info_.workLower_[iCol] = -1000,
      info_.workUpper_[iCol] = 1000;  // FREE
    } else if (info_.workLower_[iCol] == -inf) {
      info_.workLower_[iCol] = -1,
      info_.workUpper_[iCol] = 0;  // UPPER
    } else if (info_.workUpper_[iCol] == inf) {
      info_.workLower_[iCol] = 0,
      info_.workUpper_[iCol] = 1;  // LOWER
    } else {
      info_.workLower_[iCol] = 0,
      info_.workUpper_[iCol] = 0;  // BOXED or FIXED
    }
    info_.workRange_[iCol] = info_.workUpper_[iCol] - info_.workLower_[iCol];
  }
}